

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall
pbrt::FormattingScene::MakeNamedMaterial
          (FormattingScene *this,string *name,ParsedParameterVector params,FileLoc loc)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  FileLoc loc_00;
  iterator iVar1;
  mapped_type *pmVar2;
  ostream *poVar3;
  mapped_type *this_01;
  ParameterDictionary *dict_00;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDX;
  int *in_R8;
  string extra;
  string local_190;
  string matName;
  string local_150;
  string local_130;
  string local_110;
  ParameterDictionary dict;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  local_88;
  
  extra._M_dataplus._M_p = (pointer)pstd::pmr::new_delete_resource();
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(&local_88,in_RDX,(polymorphic_allocator<pbrt::ParsedParameter_*> *)&extra);
  ParameterDictionary::ParameterDictionary(&dict,&local_88,RGBColorSpace::sRGB);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&local_88);
  if (this->upgrade == true) {
    ParameterDictionary::RenameUsedTextures(&dict,&this->definedTextures);
    this_00 = &this->definedNamedMaterials;
    iVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)this_00,name);
    if (iVar1._M_node == (_Base_ptr)&this->field_0x50) {
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this_00,name);
      std::__cxx11::string::_M_assign((string *)pmVar2);
    }
    else {
      Warning<std::__cxx11::string_const&>
                ((FileLoc *)&params,"%s: renaming multiply-defined named material",name);
      matName._M_dataplus._M_p._0_4_ = MakeNamedMaterial::count;
      MakeNamedMaterial::count = MakeNamedMaterial::count + 1;
      StringPrintf<std::__cxx11::string_const&,int>
                (&extra,(pbrt *)"%s-renamed-%d",(char *)name,&matName,in_R8);
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this_00,name);
      std::__cxx11::string::operator=((string *)pmVar2,(string *)&extra);
      std::__cxx11::string::~string((string *)&extra);
    }
    indent_abi_cxx11_(&extra,this,0);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,name);
    Printf<std::__cxx11::string,std::__cxx11::string&>("%sMakeNamedMaterial \"%s\"\n",&extra,pmVar2)
    ;
  }
  else {
    indent_abi_cxx11_(&extra,this,0);
    Printf<std::__cxx11::string,std::__cxx11::string_const&>
              ("%sMakeNamedMaterial \"%s\"\n",&extra,name);
  }
  std::__cxx11::string::~string((string *)&extra);
  extra._M_dataplus._M_p = (pointer)&extra.field_2;
  extra._M_string_length = 0;
  extra.field_2._M_local_buf[0] = '\0';
  if (this->upgrade == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_190,"type",(allocator<char> *)&local_110);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,"",(allocator<char> *)&local_130);
    ParameterDictionary::GetOneString(&matName,&dict,&local_190,&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_190);
    dict_00 = &dict;
    loc_00.filename._M_str = (char *)params.ptr;
    loc_00.filename._M_len = (size_t)params.alloc.memoryResource;
    loc_00._16_8_ = params.field_2.fixed[0];
    upgradeMaterial(&local_190,this,&matName,dict_00,loc_00);
    std::__cxx11::string::operator=((string *)&extra,(string *)&local_190);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_190,"type",(allocator<char> *)&local_150);
    ParameterDictionary::RemoveString(&dict,&local_190);
    std::__cxx11::string::~string((string *)&local_190);
    indent_abi_cxx11_(&local_110,this,1);
    StringPrintf<std::__cxx11::string&>
              (&local_130,(pbrt *)"\"string type\" [ \"%s\" ]\n",(char *)&matName,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)dict_00);
    std::operator+(&local_150,&local_110,&local_130);
    std::operator+(&local_190,&local_150,&extra);
    std::__cxx11::string::operator=((string *)&extra,(string *)&local_190);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&matName);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)&extra);
  ParameterDictionary::ToParameterList_abi_cxx11_
            (&matName,&dict,*(int *)&(this->super_SceneRepresentation).field_0xc);
  std::operator<<(poVar3,(string *)&matName);
  std::__cxx11::string::~string((string *)&matName);
  if (this->upgrade == true) {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->definedNamedMaterials,name);
    this_01 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::ParameterDictionary,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::ParameterDictionary>_>_>
              ::operator[](&this->namedMaterialDictionaries,pmVar2);
    ParameterDictionary::operator=(this_01,&dict);
  }
  std::__cxx11::string::~string((string *)&extra);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&dict.params);
  return;
}

Assistant:

void FormattingScene::MakeNamedMaterial(const std::string &name,
                                        ParsedParameterVector params, FileLoc loc) {
    ParameterDictionary dict(params, RGBColorSpace::sRGB);

    if (upgrade) {
        dict.RenameUsedTextures(definedTextures);

        if (definedNamedMaterials.find(name) != definedNamedMaterials.end()) {
            static int count = 0;
            Warning(&loc, "%s: renaming multiply-defined named material", name);
            definedNamedMaterials[name] = StringPrintf("%s-renamed-%d", name, count++);
        } else
            definedNamedMaterials[name] = name;
        Printf("%sMakeNamedMaterial \"%s\"\n", indent(), definedNamedMaterials[name]);
    } else
        Printf("%sMakeNamedMaterial \"%s\"\n", indent(), name);

    std::string extra;
    if (upgrade) {
        std::string matName = dict.GetOneString("type", "");
        extra = upgradeMaterial(&matName, &dict, loc);
        dict.RemoveString("type");
        extra = indent(1) + StringPrintf("\"string type\" [ \"%s\" ]\n", matName) + extra;
    }
    std::cout << extra << dict.ToParameterList(catIndentCount);

    if (upgrade)
        namedMaterialDictionaries[definedNamedMaterials[name]] = std::move(dict);
}